

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_surface.cpp
# Opt level: O0

Reals __thiscall Omega_h::get_side_vectors(Omega_h *this,Mesh *mesh,LOs *surf_side2side)

{
  LOs *pLVar1;
  Int IVar2;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *pvVar3;
  Reals RVar4;
  Read<int> local_50 [2];
  Read<int> local_30;
  LOs *local_20;
  LOs *surf_side2side_local;
  Mesh *mesh_local;
  
  local_20 = surf_side2side;
  surf_side2side_local = (LOs *)mesh;
  mesh_local = (Mesh *)this;
  IVar2 = Mesh::dim(mesh);
  pLVar1 = surf_side2side_local;
  if (IVar2 == 3) {
    Read<int>::Read(&local_30,surf_side2side);
    anon_unknown_15::get_triangle_normals((anon_unknown_15 *)this,(Mesh *)pLVar1,&local_30);
    Read<int>::~Read(&local_30);
    pvVar3 = extraout_RDX;
  }
  else {
    IVar2 = Mesh::dim((Mesh *)surf_side2side_local);
    pLVar1 = surf_side2side_local;
    if (IVar2 != 2) {
      fail("assertion %s failed at %s +%d\n","false",
           "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_surface.cpp"
           ,0x54);
    }
    Read<int>::Read(local_50,surf_side2side);
    anon_unknown_15::get_edge_normals((anon_unknown_15 *)this,(Mesh *)pLVar1,local_50);
    Read<int>::~Read(local_50);
    pvVar3 = extraout_RDX_00;
  }
  RVar4.write_.shared_alloc_.direct_ptr = pvVar3;
  RVar4.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Reals)RVar4.write_.shared_alloc_;
}

Assistant:

Reals get_side_vectors(Mesh* mesh, LOs surf_side2side) {
  if (mesh->dim() == 3) return get_triangle_normals(mesh, surf_side2side);
  if (mesh->dim() == 2) return get_edge_normals(mesh, surf_side2side);
  OMEGA_H_NORETURN(Reals());
}